

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

void __thiscall
cinject::ComponentBuilderBase<IWalker,ICrawler,ISwimmer,IWaterConsumer,Turtle>::
registerType<Turtle,cinject::InstanceStorage<Turtle,cinject::ConstructorFactory<Turtle,void>>,IWalker,ICrawler,ISwimmer,IWaterConsumer,Turtle>
          (ComponentBuilderBase<IWalker,ICrawler,ISwimmer,IWaterConsumer,Turtle> *this,
          shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
          *instanceStorage)

{
  shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
  local_48 [2];
  shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_> local_28
  ;
  shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
  *local_18;
  shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
  *instanceStorage_local;
  ComponentBuilderBase<IWalker,_ICrawler,_ISwimmer,_IWaterConsumer,_Turtle> *this_local;
  
  local_18 = instanceStorage;
  instanceStorage_local =
       (shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_> *)
       this;
  std::shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>::
  shared_ptr(&local_28,instanceStorage);
  addRegistration<Turtle,cinject::InstanceStorage<Turtle,cinject::ConstructorFactory<Turtle,void>>,IWalker>
            (this,&local_28);
  std::shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>::
  ~shared_ptr(&local_28);
  std::shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>::
  shared_ptr(local_48,instanceStorage);
  registerType<Turtle,cinject::InstanceStorage<Turtle,cinject::ConstructorFactory<Turtle,void>>,ICrawler,ISwimmer,IWaterConsumer,Turtle>
            (this,local_48);
  std::shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>::
  ~shared_ptr(local_48);
  return;
}

Assistant:

void registerType(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        // register
        addRegistration<TImplementation, TInstanceStorage, TComponent1>(instanceStorage);


        registerType<TImplementation, TInstanceStorage, TComponentOther, TRest...>(instanceStorage);
    }